

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

size_t rtosc_print_message(char *address,rtosc_arg_val_t *args,size_t n,char *buffer,size_t bs,
                          rtosc_print_options *opt,int cols_used)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  char *in_RCX;
  size_t in_RDX;
  rtosc_arg_val_t *in_RSI;
  undefined8 in_RDI;
  size_t in_R8;
  rtosc_print_options *in_R9;
  size_t wrt;
  
  iVar1 = asnprintf(in_RCX,in_R8,"%s ",in_RDI);
  lVar2 = (long)iVar1;
  sVar3 = rtosc_print_arg_vals(in_RSI,in_RDX,in_RCX + lVar2,in_R8 - lVar2,in_R9,(int)opt + iVar1);
  return sVar3 + lVar2;
}

Assistant:

size_t rtosc_print_message(const char* address,
                           const rtosc_arg_val_t *args, size_t n,
                           char *buffer, size_t bs,
                           const rtosc_print_options* opt,
                           int cols_used)
{
    size_t wrt = asnprintf(buffer, bs, "%s ", address);
    cols_used += wrt;
    buffer += wrt;
    bs -= wrt;
    wrt += rtosc_print_arg_vals(args, n, buffer, bs, opt, cols_used);
    return wrt;
}